

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O0

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
CP::stack<int>::distribute
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,stack<int> *this,size_t k)

{
  ulong uVar1;
  reference this_00;
  long lVar2;
  ulong local_68;
  size_t j;
  size_t size;
  size_t i;
  ulong uStack_48;
  int ind;
  size_t remain;
  size_t least;
  allocator<std::vector<int,_std::allocator<int>_>_> local_22;
  undefined1 local_21;
  size_t local_20;
  size_t k_local;
  stack<int> *this_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *v;
  
  local_21 = 0;
  local_20 = k;
  k_local = (size_t)this;
  this_local = (stack<int> *)__return_storage_ptr__;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_22);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,k,&local_22);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_22);
  uVar1 = this->mSize / local_20;
  uStack_48 = this->mSize % local_20;
  i._4_4_ = (int)this->mSize + -1;
  for (size = 0; size < local_20; size = size + 1) {
    j = uVar1;
    if (uStack_48 != 0) {
      j = uVar1 + 1;
      uStack_48 = uStack_48 - 1;
    }
    for (local_68 = 0; local_68 < j; local_68 = local_68 + 1) {
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](__return_storage_ptr__,size);
      lVar2 = (long)i._4_4_;
      i._4_4_ = i._4_4_ + -1;
      std::vector<int,_std::allocator<int>_>::push_back(this_00,this->mData + lVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<T>> CP::stack<T>::distribute(size_t k) const {
    std::vector<std::vector<T>> v(k);
    size_t least = mSize / k;
    size_t remain = mSize % k;
    int ind = mSize - 1;
    for (size_t i = 0; i < k; ++i) {
      size_t size = least; 
      if (remain > 0) {
        size++;
        remain--;
      }
      for (size_t j = 0; j < size; ++j) {
        v[i].push_back(*(mData+(ind--)));
      }
    }
    return v;
}